

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O1

vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *
wasm::analysis::ReachingDefinitionsTransferFunction::listLocalSets
          (vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__return_storage_ptr__,
          Function *func,
          vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_> *fakeInitialValueSets,
          unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
          *fakeSetPtrs)

{
  pointer *ppLVar1;
  iterator __position;
  long lVar2;
  ulong uVar3;
  pointer pLVar4;
  ulong uVar5;
  __hashtable *__h;
  long local_70;
  undefined1 auStack_68 [8];
  FindAll<wasm::LocalSet> setFinder;
  LocalSet *local_40;
  vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *local_38;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *setsList;
  
  local_38 = (vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)__return_storage_ptr__;
  lVar2 = ::wasm::Function::getNumLocals();
  if (lVar2 != 0) {
    uVar5 = 0;
    do {
      auStack_68[0] = LocalSetId;
      setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
      .super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(setFinder.list.
                             super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,(int)uVar5);
      __position._M_current =
           (fakeInitialValueSets->
           super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (fakeInitialValueSets->super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::LocalSet,std::allocator<wasm::LocalSet>>::
        _M_realloc_insert<wasm::LocalSet_const&>
                  ((vector<wasm::LocalSet,std::allocator<wasm::LocalSet>> *)fakeInitialValueSets,
                   __position,(LocalSet *)auStack_68);
      }
      else {
        *(pointer *)&(__position._M_current)->index =
             setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (__position._M_current)->value =
             (Expression *)
             setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        ((__position._M_current)->super_SpecificExpression<(wasm::Expression::Id)9>).
        super_Expression._id = auStack_68;
        ((__position._M_current)->super_SpecificExpression<(wasm::Expression::Id)9>).
        super_Expression.type.id = 0;
        ppLVar1 = &(fakeInitialValueSets->
                   super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      uVar3 = ::wasm::Function::getNumLocals();
    } while (uVar5 < uVar3);
  }
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)auStack_68,func->body);
  *(undefined1 (*) [8])local_38 = auStack_68;
  *(pointer *)(local_38 + 8) =
       setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(local_38 + 0x10) =
       setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])0x0;
  setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  setFinder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar4 = (fakeInitialValueSets->
           super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((fakeInitialValueSets->super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>).
      _M_impl.super__Vector_impl_data._M_finish != pLVar4) {
    lVar2 = 0;
    uVar5 = 0;
    do {
      local_40 = (LocalSet *)
                 (&(pLVar4->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                 + lVar2);
      std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::emplace_back<wasm::LocalSet*>
                (local_38,&local_40);
      local_70 = (long)&(((fakeInitialValueSets->
                          super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>).
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id +
                 lVar2;
      local_40 = (LocalSet *)fakeSetPtrs;
      std::
      _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<wasm::LocalSet*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
                ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)fakeSetPtrs,&local_70,&local_40);
      uVar5 = uVar5 + 1;
      pLVar4 = (fakeInitialValueSets->
               super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
    } while (uVar5 < (ulong)((long)(fakeInitialValueSets->
                                   super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4 >> 5))
    ;
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)setFinder.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  return (vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_38;
}

Assistant:

static std::vector<LocalSet*>
  listLocalSets(Function* func,
                std::vector<LocalSet>& fakeInitialValueSets,
                std::unordered_set<LocalSet*>& fakeSetPtrs) {
    // Create a fictitious LocalSet for each local index.
    for (Index i = 0; i < func->getNumLocals(); ++i) {
      LocalSet currSet;
      currSet.index = i;
      fakeInitialValueSets.push_back(currSet);
    }

    // Find all actual LocalSets.
    FindAll<LocalSet> setFinder(func->body);
    std::vector<LocalSet*> setsList = std::move(setFinder.list);

    // Take a pointer for each fictitious LocalSet.
    for (size_t i = 0; i < fakeInitialValueSets.size(); ++i) {
      setsList.push_back(&fakeInitialValueSets[i]);
      fakeSetPtrs.insert(&fakeInitialValueSets[i]);
    }
    return setsList;
  }